

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  ostream *poVar9;
  ulong uVar10;
  string inputpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string outputpath;
  string arg;
  stat info;
  char *local_600;
  long local_5f8;
  char local_5f0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e0;
  ulong local_5c8;
  undefined1 *local_5c0;
  long local_5b8;
  undefined1 local_5b0 [16];
  string local_5a0;
  string local_580;
  string local_560;
  undefined1 local_540 [1152];
  stat local_c0;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_5e0,
             argv + 1,argv + argc,(allocator_type *)local_540);
  if (local_5e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_5e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_600 = local_5f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"");
    local_5c0 = local_5b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"");
    local_5c8 = 0;
    iVar5 = 0;
    do {
      uVar10 = (ulong)iVar5;
      if ((ulong)((long)local_5e0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_5e0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) break;
      lVar6 = std::__cxx11::string::rfind
                        ((char *)(local_5e0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar10),0x126004,0);
      if (lVar6 != 0) break;
      pcVar2 = local_5e0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
      local_540._0_8_ = (xml_node_struct *)(local_540 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_540,pcVar2,
                 pcVar2 + local_5e0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
      iVar1 = iVar5 + 1;
      uVar7 = std::__cxx11::string::compare((char *)local_540);
      bVar3 = true;
      if ((int)uVar7 == 0) {
        local_5c8 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_540);
        if (iVar4 == 0) {
          lVar6 = 0x17;
          pcVar8 = "-i requires a file path";
          if ((ulong)(long)iVar1 <
              (ulong)((long)local_5e0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_5e0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_600);
            iVar1 = iVar5 + 2;
          }
          else {
LAB_00106431:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar6);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_540);
          if (iVar4 == 0) {
            lVar6 = 0x12;
            pcVar8 = "-o requires a path";
            if ((ulong)((long)local_5e0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_5e0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)iVar1)
            goto LAB_00106431;
            std::__cxx11::string::_M_assign((string *)&local_5c0);
            bVar3 = false;
            iVar1 = iVar5 + 2;
          }
        }
      }
      iVar5 = iVar1;
      if ((xml_node_struct *)local_540._0_8_ != (xml_node_struct *)(local_540 + 0x10)) {
        operator_delete((void *)local_540._0_8_);
      }
    } while (bVar3);
    if (local_5f8 != 0) {
      iVar5 = stat(local_600,&local_c0);
      if (iVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Opening \"",9);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_600,local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::string::string((string *)&local_560,local_600,(allocator *)&local_5a0);
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_580,local_5c0,local_5c0 + local_5b8);
        project::project((project *)local_540,&local_560,&local_580);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p);
        }
        project::gen_cmake((project *)local_540);
        if ((local_5c8 & 1) != 0) {
          project::print((project *)local_540);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Created \"",9);
        project::get_cmake_file_abi_cxx11_(&local_5a0,(project *)local_540);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_5a0._M_dataplus._M_p,
                            local_5a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p);
        }
        project::~project((project *)local_540);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"In-Valid file: ",0xf);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_600,local_5f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
    }
    if (local_5c0 != local_5b0) {
      operator_delete(local_5c0);
    }
    if (local_600 != local_5f0) {
      operator_delete(local_600);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5e0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv + 1, argv + argc);

    if (args.size() != 0)
    {
        bool verbose = false;
        std::string inputpath = "";
        std::string outputpath = "";

        int i = 0;
        while (i < args.size() && (args[i].rfind("-", 0) == 0))
        {
            std::string arg = args[i++];
            if (arg == "-v")
            {
                verbose = true;
            }
            else if (arg == "-i")
            {
                if (i < args.size())
                {
                    inputpath = args[i++];
                }
                else
                {
                    std::cerr << "-i requires a file path" << std::endl;
                }
            }
            else if (arg == "-o")
            {
                if (i < args.size())
                {
                    outputpath = args[i++];
                    break;
                }
                else
                {
                    std::cerr << "-o requires a path" << std::endl;
                }
            }
        }

        if(!inputpath.empty())
        {
            struct stat info;
            if( stat( inputpath.c_str(), &info ) == 0 )
            {
                std::cout << "Opening \"" << inputpath << "\"" << std::endl;
                auto proj = project(inputpath.c_str(), outputpath);
                proj.gen_cmake();
                if(verbose)
                {
                    proj.print();
                }
                std::cout << "Created \"" << proj.get_cmake_file() << "\"" << std::endl;
            }
            else
            {
                std::cerr << "In-Valid file: " << inputpath << std::endl;
            }
        }
    }
}